

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiMultiSelectTempData>::resize
          (ImVector<ImGuiMultiSelectTempData> *this,int new_size,ImGuiMultiSelectTempData *v)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ImGuiMultiSelectTempData *pIVar4;
  undefined8 *puVar5;
  long lVar6;
  byte bVar7;
  
  bVar7 = 0;
  iVar3 = this->Capacity;
  if (iVar3 < new_size) {
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar3 <= new_size) {
      iVar3 = new_size;
    }
    reserve(this,iVar3);
  }
  lVar2 = (long)this->Size;
  if (this->Size < new_size) {
    lVar6 = lVar2 * 0x60;
    for (; lVar2 < new_size; lVar2 = lVar2 + 1) {
      pIVar4 = v;
      puVar5 = (undefined8 *)((long)&(this->Data->IO).Requests.Size + lVar6);
      for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar5 = *(undefined8 *)&(pIVar4->IO).Requests;
        pIVar4 = (ImGuiMultiSelectTempData *)((long)pIVar4 + (ulong)bVar7 * -0x10 + 8);
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      lVar6 = lVar6 + 0x60;
    }
  }
  this->Size = new_size;
  return;
}

Assistant:

inline void         resize(int new_size, const T& v)    { if (new_size > Capacity) reserve(_grow_capacity(new_size)); if (new_size > Size) for (int n = Size; n < new_size; n++) memcpy(&Data[n], &v, sizeof(v)); Size = new_size; }